

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

terminal_color __thiscall
slang::TextDiagnosticClient::getSeverityColor
          (TextDiagnosticClient *this,DiagnosticSeverity severity)

{
  switch(severity) {
  case Note:
    return (this->super_DiagnosticClient).field_0x19;
  case Warning:
    return (this->super_DiagnosticClient).field_0x1a;
  case Error:
    return (this->super_DiagnosticClient).field_0x1b;
  case Fatal:
    return (this->super_DiagnosticClient).field_0x1c;
  default:
    return black;
  }
}

Assistant:

fmt::terminal_color TextDiagnosticClient::getSeverityColor(DiagnosticSeverity severity) const {
    switch (severity) {
        case DiagnosticSeverity::Note:
            return noteColor;
        case DiagnosticSeverity::Warning:
            return warningColor;
        case DiagnosticSeverity::Error:
            return errorColor;
        case DiagnosticSeverity::Fatal:
            return fatalColor;
        default:
            return fmt::terminal_color::black;
    }
}